

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O0

int32_t icu_63::Grego::dayOfWeekInMonth(int32_t year,int32_t month,int32_t dom)

{
  int8_t iVar1;
  undefined4 local_18;
  int32_t weekInMonth;
  int32_t dom_local;
  int32_t month_local;
  int32_t year_local;
  
  local_18 = (dom + 6) / 7;
  if (local_18 == 4) {
    iVar1 = monthLength(year,month);
    if ((int)iVar1 < dom + 7) {
      local_18 = -1;
    }
  }
  else if (local_18 == 5) {
    local_18 = -1;
  }
  return local_18;
}

Assistant:

int32_t Grego::dayOfWeekInMonth(int32_t year, int32_t month, int32_t dom) {
    int32_t weekInMonth = (dom + 6)/7;
    if (weekInMonth == 4) {
        if (dom + 7 > monthLength(year, month)) {
            weekInMonth = -1;
        }
    } else if (weekInMonth == 5) {
        weekInMonth = -1;
    }
    return weekInMonth;
}